

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

ssize_t __thiscall
cashew::Value::splice
          (Value *this,int __fdin,__off64_t *__offin,int __fdout,__off64_t *__offout,size_t __len,
          uint __flags)

{
  ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref> *this_00;
  ssize_t extraout_RAX;
  Iterator end_it;
  Iterator start_it;
  
  if (this->type == Array) {
    this_00 = &((this->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>;
    end_it.index = (long)(int)__offin + (long)__fdin;
    end_it.parent = (ArrayStorage *)this_00;
    start_it.index = (long)__fdin;
    start_it.parent = (ArrayStorage *)this_00;
    ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::erase(this_00,start_it,end_it);
    return extraout_RAX;
  }
  __assert_fail("isArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x1c6,"void cashew::Value::splice(int, int)");
}

Assistant:

bool isArray() { return type == Array; }